

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<unsigned_int>
slang::parseInt<unsigned_int>(string_view name,string_view value,string *error)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  v9 *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  __integer_from_chars_result_type<unsigned_int> _Var4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  basic_string_view<char,_std::char_traits<char>_> *local_258 [2];
  string local_248;
  char *local_228;
  __integer_from_chars_result_type<unsigned_int> result;
  const_pointer end;
  char *pcStack_208;
  uint val;
  string local_1f8;
  string *local_1d8;
  string *error_local;
  string_view value_local;
  string_view name_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_1a8 [2];
  undefined1 local_198 [16];
  v9 *local_188;
  char *local_180;
  char **local_178;
  v9 *local_170;
  char *pcStack_168;
  string *local_160;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_158;
  undefined1 local_138 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  char *local_120;
  char **local_118;
  v9 *local_110;
  basic_string_view<char,_std::char_traits<char>_> *local_108;
  char *pcStack_100;
  string *local_f8;
  char *local_f0;
  basic_string_view<char,_std::char_traits<char>_> **local_e8;
  basic_string_view<char,_std::char_traits<char>_> **local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d8;
  char *pcStack_d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  char *local_90;
  basic_string_view<char,_std::char_traits<char>_> **local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  v9 **local_50;
  v9 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_10;
  
  this = (v9 *)name._M_str;
  value_local._M_str = (char *)name._M_len;
  value_local._M_len = (size_t)value._M_str;
  error_local = (string *)value._M_len;
  local_1d8 = error;
  name_local._M_len = (size_t)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  if (bVar1) {
    local_70 = (undefined1 *)&stack0xfffffffffffffdf8;
    local_78 = "expected value for argument \'{}\'";
    local_68 = "expected value for argument \'{}\'";
    pcStack_208 = "expected value for argument \'{}\'";
    local_60 = local_70;
    local_180 = (char *)std::char_traits<char>::length("expected value for argument \'{}\'");
    local_58 = local_78;
    local_160 = &local_1f8;
    local_170 = (v9 *)pcStack_208;
    local_178 = &value_local._M_str;
    local_50 = &local_170;
    local_188 = (v9 *)pcStack_208;
    pcStack_168 = local_180;
    local_48 = local_188;
    pcStack_40 = local_180;
    local_1a8[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                               *)local_178,this,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_160);
    local_30 = local_198;
    local_38 = local_1a8;
    local_20 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_180;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(&local_1f8,local_188,fmt,args);
    std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&name_local._M_str);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    result._8_8_ = pvVar2 + sVar3;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    _Var4 = std::from_chars<unsigned_int>(pvVar2,(char *)result._8_8_,(uint *)((long)&end + 4),10);
    local_228 = _Var4.ptr;
    result.ptr._0_4_ = _Var4.ec;
    if (((errc)result.ptr == 0) && (local_228 == (char *)result._8_8_)) {
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)&name_local._M_str,(uint *)((long)&end + 4));
    }
    else {
      local_e8 = local_258;
      local_f0 = "invalid value \'{}\' for integer argument \'{}\'";
      local_90 = "invalid value \'{}\' for integer argument \'{}\'";
      local_258[0] = (basic_string_view<char,_std::char_traits<char>_> *)0x6e0536;
      local_88 = local_e8;
      local_120 = (char *)std::char_traits<char>::length
                                    ("invalid value \'{}\' for integer argument \'{}\'");
      local_80 = local_f0;
      local_f8 = &local_248;
      local_108 = local_258[0];
      local_110 = (v9 *)&error_local;
      local_118 = &value_local._M_str;
      local_e0 = &local_108;
      local_128 = local_258[0];
      pcStack_100 = local_120;
      local_d8 = local_128;
      pcStack_d0 = local_120;
      ::fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                (&local_158,local_110,(basic_string_view<char,_std::char_traits<char>_> *)local_118,
                 local_258[0]);
      local_b8 = local_138;
      local_c0 = &local_158;
      local_a0 = 0xdd;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = local_120;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_c0;
      local_b0 = local_c0;
      local_a8 = local_c0;
      local_98 = local_b8;
      ::fmt::v9::vformat_abi_cxx11_(&local_248,(v9 *)local_128,fmt_00,args_00);
      std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&name_local._M_str);
    }
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)name_local._M_str;
}

Assistant:

static std::optional<T> parseInt(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}